

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O1

void __thiscall SPSUnit::insertHrdParameters(SPSUnit *this)

{
  HRDParams *params;
  HRDParams *pHVar1;
  pointer pHVar2;
  undefined8 uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  undefined3 uVar7;
  pointer pHVar8;
  int iVar9;
  int iVar10;
  pointer pHVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  pointer pHVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  long local_40;
  long local_38;
  
  lVar18 = (long)(this->mvcNalHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->mvcNalHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (lVar18 != 0) {
    lVar14 = (lVar18 >> 5) * -0x5555555555555555;
    do {
      lVar14 = lVar14 + -1;
      pHVar11 = (this->mvcNalHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (((&pHVar11[-1].isPresent)[lVar18] != true) ||
         ((&(this->mvcVclHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>.
            _M_impl.super__Vector_impl_data._M_start[-1].isPresent)[lVar18] == false)) {
        pHVar16 = pHVar11 + lVar14;
        iVar10 = *(int *)((long)pHVar11 + lVar18 + -0x5c);
        pHVar2 = (this->mvcVclHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pHVar8 = (pointer)(&pHVar2[-1].isPresent + lVar18);
        iVar9 = *(int *)((long)pHVar2 + lVar18 + -0x5c);
        if (((&pHVar11[-1].isPresent)[lVar18] == false) && (pHVar8->isPresent != false)) {
          uVar3 = *(undefined8 *)pHVar8;
          *(undefined8 *)((long)pHVar11 + lVar18 + -0x5a) =
               *(undefined8 *)((long)pHVar2 + lVar18 + -0x5a);
          *(undefined8 *)(&pHVar11[-1].isPresent + lVar18) = uVar3;
          pHVar11 = pHVar16;
          pHVar16 = pHVar8;
        }
        else {
          uVar3 = *(undefined8 *)(&pHVar11[-1].isPresent + lVar18);
          *(undefined8 *)((long)pHVar2 + lVar18 + -0x5a) =
               *(undefined8 *)((long)pHVar11 + lVar18 + -0x5a);
          *(undefined8 *)pHVar8 = uVar3;
          pHVar11 = pHVar8;
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (&pHVar11->bit_rate_value_minus1,&pHVar16->bit_rate_value_minus1);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (&pHVar11->cpb_size_value_minus1,&pHVar16->cpb_size_value_minus1);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&pHVar11->cbr_flag,&pHVar16->cbr_flag);
        uVar4 = pHVar16->cpb_removal_delay_length_minus1;
        uVar5 = pHVar16->dpb_output_delay_length_minus1;
        uVar6 = pHVar16->time_offset_length;
        pHVar11->initial_cpb_removal_delay_length_minus1 =
             pHVar16->initial_cpb_removal_delay_length_minus1;
        pHVar11->cpb_removal_delay_length_minus1 = uVar4;
        pHVar11->dpb_output_delay_length_minus1 = uVar5;
        pHVar11->time_offset_length = uVar6;
        insertHrdData(this,(this->mvcHrdParamsBitPos).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar14],iVar10,iVar9,false,
                      (HRDParams *)
                      (&(this->mvcNalHrdParams).
                        super__Vector_base<HRDParams,_std::allocator<HRDParams>_>._M_impl.
                        super__Vector_impl_data._M_start[-1].isPresent + lVar18));
        (&(this->mvcNalHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>._M_impl.
          super__Vector_impl_data._M_start[-1].isPresent)[lVar18] = true;
        (&(this->mvcVclHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>._M_impl.
          super__Vector_impl_data._M_start[-1].isPresent)[lVar18] = true;
      }
      lVar18 = lVar18 + -0x60;
    } while (lVar14 != 0);
  }
  bVar20 = (this->nalHrdParams).isPresent;
  if ((bVar20 == false) || ((this->vclHrdParams).isPresent == false)) {
    params = &this->nalHrdParams;
    iVar10 = (this->nalHrdParams).bitLen;
    iVar9 = (this->vclHrdParams).bitLen;
    pHVar1 = &this->vclHrdParams;
    if ((bVar20 == false) && (pHVar1->isPresent != false)) {
      bVar20 = pHVar1->isPresent;
      uVar7 = *(undefined3 *)&pHVar1->field_0x1;
      iVar12 = pHVar1->bitLen;
      *(undefined8 *)((long)&(this->nalHrdParams).bitLen + 2) =
           *(undefined8 *)((long)&(this->vclHrdParams).bitLen + 2);
      params->isPresent = bVar20;
      *(undefined3 *)&params->field_0x1 = uVar7;
      params->bitLen = iVar12;
      local_38 = 0x198;
      local_40 = 0x138;
      lVar15 = 0x180;
      lVar17 = 0x120;
      lVar19 = 0x168;
      lVar18 = 0x108;
      lVar14 = 0x150;
      lVar13 = 0xf0;
    }
    else {
      bVar20 = params->isPresent;
      uVar7 = *(undefined3 *)&params->field_0x1;
      iVar12 = params->bitLen;
      *(undefined8 *)((long)&(this->vclHrdParams).bitLen + 2) =
           *(undefined8 *)((long)&(this->nalHrdParams).bitLen + 2);
      pHVar1->isPresent = bVar20;
      *(undefined3 *)&pHVar1->field_0x1 = uVar7;
      pHVar1->bitLen = iVar12;
      local_38 = 0x138;
      local_40 = 0x198;
      lVar15 = 0x120;
      lVar17 = 0x180;
      lVar19 = 0x108;
      lVar18 = 0x168;
      lVar14 = 0xf0;
      lVar13 = 0x150;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(this->super_NALUnit)._vptr_NALUnit + lVar13),
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(this->super_NALUnit)._vptr_NALUnit + lVar14));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(this->super_NALUnit)._vptr_NALUnit + lVar18),
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(this->super_NALUnit)._vptr_NALUnit + lVar19));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&(this->super_NALUnit)._vptr_NALUnit + lVar17),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&(this->super_NALUnit)._vptr_NALUnit + lVar15));
    *(undefined4 *)((long)&(this->super_NALUnit)._vptr_NALUnit + local_40) =
         *(undefined4 *)((long)&(this->super_NALUnit)._vptr_NALUnit + local_38);
    iVar12 = this->hrdParamsBitPos;
    bVar20 = iVar12 == -1;
    if (bVar20) {
      iVar12 = this->vui_parameters_bit_pos;
      iVar10 = 0;
      iVar9 = 0;
    }
    insertHrdData(this,iVar12,iVar10,iVar9,bVar20,params);
    params->isPresent = true;
    pHVar1->isPresent = true;
  }
  (this->nalHrdParams).isPresent = true;
  (this->vclHrdParams).isPresent = true;
  if (this->fixed_frame_rate_flag == 0) {
    updateTimingInfo(this);
    return;
  }
  return;
}

Assistant:

void SPSUnit::insertHrdParameters()
{
    for (size_t i = mvcNalHrdParams.size(); i-- > 0;)
    {
        if (!mvcNalHrdParams[i].isPresent || !mvcVclHrdParams[i].isPresent)
        {
            const int nalBitLen = mvcNalHrdParams[i].bitLen;
            const int vclBitLen = mvcVclHrdParams[i].bitLen;

            if (mvcNalHrdParams[i].isPresent || !mvcVclHrdParams[i].isPresent)
                mvcVclHrdParams[i] = mvcNalHrdParams[i];
            else if (!mvcNalHrdParams[i].isPresent || mvcVclHrdParams[i].isPresent)
                mvcNalHrdParams[i] = mvcVclHrdParams[i];
            else
            {
                mvcNalHrdParams[i].resetDefault(true);
                mvcVclHrdParams[i].resetDefault(true);
            }

            insertHrdData(mvcHrdParamsBitPos[i], nalBitLen, vclBitLen, false, mvcNalHrdParams[i]);
            mvcNalHrdParams[i].isPresent = true;
            mvcVclHrdParams[i].isPresent = true;
        }
    }

    if (!nalHrdParams.isPresent || !vclHrdParams.isPresent)
    {
        const int nalBitLen = nalHrdParams.bitLen;
        const int vclBitLen = vclHrdParams.bitLen;

        if (nalHrdParams.isPresent || !vclHrdParams.isPresent)
            vclHrdParams = nalHrdParams;
        else if (!nalHrdParams.isPresent || vclHrdParams.isPresent)
            nalHrdParams = vclHrdParams;
        else
        {
            nalHrdParams.resetDefault(false);
            vclHrdParams.resetDefault(false);
        }

        if (hrdParamsBitPos != -1)
            insertHrdData(hrdParamsBitPos, nalBitLen, vclBitLen, false, nalHrdParams);
        else
            insertHrdData(vui_parameters_bit_pos, 0, 0, true, nalHrdParams);
        nalHrdParams.isPresent = true;
        vclHrdParams.isPresent = true;
    }
    nalHrdParams.isPresent = true;
    vclHrdParams.isPresent = true;

    if (!fixed_frame_rate_flag)
        updateTimingInfo();
}